

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O1

void Dsd_TreeNodeGetInfoOne(Dsd_Node_t *pNode,int *DepthMax,int *GateSizeMax)

{
  s_DepthMax = 0;
  s_GateSizeMax = 0;
  Dsd_TreeGetInfo_rec((Dsd_Node_t *)((ulong)pNode & 0xfffffffffffffffe),0);
  if (DepthMax != (int *)0x0) {
    *DepthMax = s_DepthMax;
  }
  if (GateSizeMax != (int *)0x0) {
    *GateSizeMax = s_GateSizeMax;
  }
  return;
}

Assistant:

void Dsd_TreeNodeGetInfoOne( Dsd_Node_t * pNode, int * DepthMax, int * GateSizeMax )
{
    s_DepthMax    = 0;
    s_GateSizeMax = 0;

    Dsd_TreeGetInfo_rec( Dsd_Regular(pNode), 0 );

    if ( DepthMax ) 
        *DepthMax     = s_DepthMax;
    if ( GateSizeMax ) 
        *GateSizeMax  = s_GateSizeMax;
}